

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_1d8c7ef::Pipe::write(Pipe *this,int __fd,void *__buf,size_t __n)

{
  size_type sVar1;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  ulong local_50;
  size_t i;
  uint8_t *src;
  undefined1 local_38 [3];
  bool notify;
  unique_lock<std::mutex> lock;
  size_t bytes_local;
  void *buffer_local;
  Pipe *this_local;
  
  lock._8_8_ = __buf;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->mutex);
  if ((this->closed & 1U) == 0) {
    if (lock._8_8_ == 0) {
      this_local._7_1_ = 1;
    }
    else {
      sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      for (local_50 = 0; local_50 < (ulong)lock._8_8_; local_50 = local_50 + 1) {
        std::deque<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char_const&>
                  ((deque<unsigned_char,std::allocator<unsigned_char>> *)&this->data,
                   (uchar *)(CONCAT44(in_register_00000034,__fd) + local_50));
      }
      if (sVar1 == 0) {
        std::condition_variable::notify_all();
      }
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool write(const void* buffer, size_t bytes) override {
    std::unique_lock<std::mutex> lock(mutex);
    if (closed) {
      return false;
    }
    if (bytes == 0) {
      return true;
    }
    auto notify = data.size() == 0;
    auto src = reinterpret_cast<const uint8_t*>(buffer);
    for (size_t i = 0; i < bytes; i++) {
      data.emplace_back(src[i]);
    }
    if (notify) {
      cv.notify_all();
    }
    return true;
  }